

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lines.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::split_lines<false,11>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char (*s_) [11])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX;
  size_t in_RCX;
  char *s__00;
  char *s__01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s__02;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c_;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__00;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__01;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__02;
  basic_file_view<false> *c__03;
  string path;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v12;
  directory tmp;
  basic_file_view<false> view6;
  ifstream fs2;
  istringstream s3;
  istringstream s2;
  istringstream s1;
  ifstream fs1;
  ifstream fs3;
  long *local_e80;
  long local_e78;
  long local_e70 [2];
  assert_equal_container local_e60;
  string local_e38;
  _anonymous_namespace_ *local_e18;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *local_e10;
  long local_e08 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_df8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_de0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_dc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_db0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d68;
  type local_d50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d08;
  directory local_cf0;
  long *local_cd0 [2];
  long local_cc0 [63];
  long *local_ac8;
  void *local_ac0;
  long local_ab8 [63];
  istringstream local_8c0 [120];
  ios_base local_848 [264];
  istringstream local_740 [120];
  ios_base local_6c8 [264];
  istringstream local_5c0 [120];
  ios_base local_548 [264];
  output_file local_440 [13];
  istream local_238 [520];
  
  just::temp::directory::directory(&local_cf0);
  local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e38,local_cf0._path._M_dataplus._M_p,
             local_cf0._path._M_dataplus._M_p + local_cf0._path._M_string_length);
  std::__cxx11::string::append((char *)&local_e38);
  local_ac8 = local_ab8;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac8,this,this + sVar2);
  just::file::impl::output_file::output_file(local_440,&local_e38);
  just::file::impl::output_file::write(local_440,(int)local_ac8,local_ac0,in_RCX);
  just::file::impl::output_file::~output_file(local_440);
  if (local_ac8 != local_ab8) {
    operator_delete(local_ac8,local_ab8[0] + 1);
  }
  std::ifstream::ifstream(local_440,local_e38._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&local_ac8,local_e38._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(local_238,local_e38._M_dataplus._M_p,_S_in|_S_bin);
  local_cd0[0] = local_cc0;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd0,this,this + sVar2);
  std::__cxx11::istringstream::istringstream(local_5c0,(string *)local_cd0,_S_in);
  if (local_cd0[0] != local_cc0) {
    operator_delete(local_cd0[0],local_cc0[0] + 1);
  }
  local_cd0[0] = local_cc0;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd0,this,this + sVar2);
  std::__cxx11::istringstream::istringstream(local_740,(string *)local_cd0,_S_in);
  if (local_cd0[0] != local_cc0) {
    operator_delete(local_cd0[0],local_cc0[0] + 1);
  }
  local_cd0[0] = local_cc0;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd0,this,this + sVar2);
  std::__cxx11::istringstream::istringstream(local_8c0,(string *)local_cd0,_S_in);
  if (local_cd0[0] != local_cc0) {
    operator_delete(local_cd0[0],local_cc0[0] + 1);
  }
  local_e18 = (_anonymous_namespace_ *)local_e08;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e18,this,this + sVar2);
  std::ifstream::ifstream(local_cd0,local_e38._M_dataplus._M_p,_S_in|_S_bin);
  just::lines::split<false,char_const>(__return_storage_ptr__,(lines *)this,s__00);
  just::lines::split<false,char_const>(&local_d38,(lines *)this,s__01);
  paVar1 = &local_e60._assert_msg._filename.field_2;
  local_e60._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e60,this,this + sVar2);
  just::lines::split<false,std::__cxx11::string>(&local_d50,(lines *)&local_e60,s__02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e60._assert_msg._filename._M_dataplus._M_p,
                    local_e60._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  just::lines::split<false>(&local_d68,(istream *)local_8c0);
  just::lines::split<false>(&local_d80,local_238);
  just::lines::split_lines_of_file<false>(&local_d98,&local_e38);
  create_vector<just::lines::basic_view<std::__cxx11::string,false>>(&local_db0,local_e18,local_e10)
  ;
  create_vector<just::lines::basic_view<std::istream,false>>
            (&local_dc8,(_anonymous_namespace_ *)local_5c0,c_);
  create_vector<just::lines::basic_view<std::istream,false>>
            (&local_de0,(_anonymous_namespace_ *)local_440,c__00);
  create_vector<just::lines::basic_view<std::istream,false>>
            (&local_df8,(_anonymous_namespace_ *)local_740,c__01);
  create_vector<just::lines::basic_view<std::istream,false>>
            (&local_d20,(_anonymous_namespace_ *)&local_ac8,c__02);
  create_vector<just::lines::basic_file_view<false>>
            (&local_d08,(_anonymous_namespace_ *)local_cd0,c__03);
  local_e80 = local_e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e60._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e60,local_e80,local_e78 + (long)local_e80);
  local_e60._assert_msg._line = 0x57;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e60,__return_storage_ptr__,&local_d38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e60._assert_msg._filename._M_dataplus._M_p,
                    local_e60._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_e80 != local_e70) {
    operator_delete(local_e80,local_e70[0] + 1);
  }
  local_e80 = local_e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e60._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e60,local_e80,local_e78 + (long)local_e80);
  local_e60._assert_msg._line = 0x58;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e60,&local_d38,&local_d50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e60._assert_msg._filename._M_dataplus._M_p,
                    local_e60._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_e80 != local_e70) {
    operator_delete(local_e80,local_e70[0] + 1);
  }
  local_e80 = local_e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e60._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e60,local_e80,local_e78 + (long)local_e80);
  local_e60._assert_msg._line = 0x59;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e60,&local_d50,&local_d68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e60._assert_msg._filename._M_dataplus._M_p,
                    local_e60._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_e80 != local_e70) {
    operator_delete(local_e80,local_e70[0] + 1);
  }
  local_e80 = local_e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e60._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e60,local_e80,local_e78 + (long)local_e80);
  local_e60._assert_msg._line = 0x5a;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e60,&local_d68,&local_d80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e60._assert_msg._filename._M_dataplus._M_p,
                    local_e60._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_e80 != local_e70) {
    operator_delete(local_e80,local_e70[0] + 1);
  }
  local_e80 = local_e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e60._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e60,local_e80,local_e78 + (long)local_e80);
  local_e60._assert_msg._line = 0x5b;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e60,&local_d80,&local_d98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e60._assert_msg._filename._M_dataplus._M_p,
                    local_e60._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_e80 != local_e70) {
    operator_delete(local_e80,local_e70[0] + 1);
  }
  local_e80 = local_e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e60._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e60,local_e80,local_e78 + (long)local_e80);
  local_e60._assert_msg._line = 0x5c;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e60,&local_d98,&local_db0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e60._assert_msg._filename._M_dataplus._M_p,
                    local_e60._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_e80 != local_e70) {
    operator_delete(local_e80,local_e70[0] + 1);
  }
  local_e80 = local_e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e60._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e60,local_e80,local_e78 + (long)local_e80);
  local_e60._assert_msg._line = 0x5d;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e60,&local_db0,&local_dc8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e60._assert_msg._filename._M_dataplus._M_p,
                    local_e60._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_e80 != local_e70) {
    operator_delete(local_e80,local_e70[0] + 1);
  }
  local_e80 = local_e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e60._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e60,local_e80,local_e78 + (long)local_e80);
  local_e60._assert_msg._line = 0x5e;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e60,&local_dc8,&local_de0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e60._assert_msg._filename._M_dataplus._M_p,
                    local_e60._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_e80 != local_e70) {
    operator_delete(local_e80,local_e70[0] + 1);
  }
  local_e80 = local_e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e60._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e60,local_e80,local_e78 + (long)local_e80);
  local_e60._assert_msg._line = 0x5f;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e60,&local_de0,&local_df8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e60._assert_msg._filename._M_dataplus._M_p,
                    local_e60._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_e80 != local_e70) {
    operator_delete(local_e80,local_e70[0] + 1);
  }
  local_e80 = local_e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e60._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e60,local_e80,local_e78 + (long)local_e80);
  local_e60._assert_msg._line = 0x60;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e60,&local_df8,&local_d20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e60._assert_msg._filename._M_dataplus._M_p,
                    local_e60._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_e80 != local_e70) {
    operator_delete(local_e80,local_e70[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_df8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_de0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_dc8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_db0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d38);
  std::ifstream::~ifstream(local_cd0);
  if (local_e18 != (_anonymous_namespace_ *)local_e08) {
    operator_delete(local_e18,local_e08[0] + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_8c0);
  std::ios_base::~ios_base(local_848);
  std::__cxx11::istringstream::~istringstream(local_740);
  std::ios_base::~ios_base(local_6c8);
  std::__cxx11::istringstream::~istringstream(local_5c0);
  std::ios_base::~ios_base(local_548);
  std::ifstream::~ifstream(local_238);
  std::ifstream::~ifstream(&local_ac8);
  std::ifstream::~ifstream(local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    operator_delete(local_e38._M_dataplus._M_p,local_e38.field_2._M_allocated_capacity + 1);
  }
  just::temp::directory::~directory(&local_cf0);
  return extraout_RAX;
}

Assistant:

std::vector<std::string> split_lines(const char (&s_)[N])
  {
    using std::vector;
    using std::string;

    just::temp::directory tmp;
    const std::string path = tmp.path() + "/test";
    just::file::write(path, s_);

    std::ifstream fs1(path.c_str(), std::ios_base::binary | std::ios_base::in);
    std::ifstream fs2(path.c_str(), std::ios_base::binary | std::ios_base::in);
    std::ifstream fs3(path.c_str(), std::ios_base::binary | std::ios_base::in);

    std::istringstream s1(s_);
    std::istringstream s2(s_);
    std::istringstream s3(s_);

    const std::string str(s_);
    const just::lines::basic_view<string, KeepNewlines> view1(str);
    just::lines::basic_view<std::istream, KeepNewlines> view2(s1);
    just::lines::basic_view<std::istream, KeepNewlines> view3(fs1);

    just::lines::basic_view<std::istream, KeepNewlines> view4(s2);
    just::lines::basic_view<std::istream, KeepNewlines> view5(fs2);
    just::lines::basic_file_view<KeepNewlines> view6(path);

    converts_to<just::lines::basic_view<std::istream, KeepNewlines> >(view6);

    const vector<string> v1 = just::lines::split<KeepNewlines>(s_);
    const vector<string> v2 = just::lines::split<KeepNewlines>(&(s_[0]));
    const vector<string> v3 = just::lines::split<KeepNewlines>(string(s_));
    const vector<string> v4 = just::lines::split<KeepNewlines>(s3);
    const vector<string> v5 = just::lines::split<KeepNewlines>(fs3);
    const vector<string> v6 =
      just::lines::split_lines_of_file<KeepNewlines>(path);
    const vector<string> v7 = create_vector(view1);
    const vector<string> v8 = create_vector(view2);
    const vector<string> v9 = create_vector(view3);
    const vector<string> v10 = create_vector(view4);
    const vector<string> v11 = create_vector(view5);
    const vector<string> v12 = create_vector(view6);
    JUST_ASSERT_EQUAL_CONTAINER(v1, v2);
    JUST_ASSERT_EQUAL_CONTAINER(v2, v3);
    JUST_ASSERT_EQUAL_CONTAINER(v3, v4);
    JUST_ASSERT_EQUAL_CONTAINER(v4, v5);
    JUST_ASSERT_EQUAL_CONTAINER(v5, v6);
    JUST_ASSERT_EQUAL_CONTAINER(v6, v7);
    JUST_ASSERT_EQUAL_CONTAINER(v7, v8);
    JUST_ASSERT_EQUAL_CONTAINER(v8, v9);
    JUST_ASSERT_EQUAL_CONTAINER(v9, v10);
    JUST_ASSERT_EQUAL_CONTAINER(v10, v11);

    return v1;
  }